

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O1

Pattern * slang::ast::StructurePattern::fromSyntax
                    (StructurePatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  Compilation *pCVar1;
  sockaddr *__addr;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  SyntaxNode *__addr_00;
  int iVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  Symbol *pSVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructurePattern *pSVar8;
  Symbol *extraout_RDX;
  specific_symbol_iterator<slang::ast::FieldSymbol> src;
  Symbol *extraout_RDX_00;
  Symbol *extraout_RDX_01;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar13;
  string_view name;
  SmallVector<slang::ast::StructurePattern::FieldPattern,_4UL> patterns;
  span<slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> local_c0;
  Scope *local_b0;
  ASTContext *local_a8;
  Compilation *local_a0;
  SmallVectorBase<slang::ast::StructurePattern::FieldPattern> local_98 [2];
  SourceRange local_40;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  local_a8 = context;
  if (targetType->canonical == (Type *)0x0) {
    Type::resolveCanonical(targetType);
  }
  local_b0 = Symbol::scopeOrNull(&targetType->canonical->super_Symbol);
  local_98[0].data_ = (pointer)local_98[0].firstElement;
  local_98[0].len = 0;
  local_98[0].cap = 4;
  ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                       (syntax->members).elements._M_ptr);
  local_a0 = pCVar1;
  if ((*ppSVar4)->kind == OrderedStructurePatternMember) {
    sVar13 = Scope::membersOfType<slang::ast::FieldSymbol>(local_b0);
    src = sVar13._M_end.current;
    sVar5 = sVar13._M_begin.current;
    uVar10 = (syntax->members).elements._M_extent._M_extent_value + 1;
    if (1 < uVar10) {
      bVar9 = false;
      uVar11 = 0;
      do {
        ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((syntax->members).elements._M_ptr + uVar11 * 2));
        __addr = *(sockaddr **)(*ppSVar4 + 1);
        pTVar6 = DeclaredType::getType((DeclaredType *)(sVar5.current + 1));
        iVar3 = Pattern::bind((int)local_a8,__addr,(socklen_t)pTVar6);
        local_c0._M_extent._M_extent_value = CONCAT44(extraout_var,iVar3);
        iVar3 = *(int *)local_c0._M_extent._M_extent_value;
        local_c0._M_ptr = (pointer)sVar5.current;
        SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::
        emplace_back<slang::ast::StructurePattern::FieldPattern>(local_98,(FieldPattern *)&local_c0)
        ;
        do {
          sVar5.current = (sVar5.current)->nextInScope;
          if (sVar5.current == (Symbol *)0x0) break;
        } while ((sVar5.current)->kind != Field);
        bVar9 = (bool)(bVar9 | iVar3 == 0);
        uVar11 = uVar11 + 1;
        src.current = extraout_RDX_00;
      } while (uVar11 != uVar10 >> 1);
      goto LAB_0033863d;
    }
  }
  else {
    uVar10 = (syntax->members).elements._M_extent._M_extent_value + 1;
    src.current = extraout_RDX;
    if (1 < uVar10) {
      uVar10 = uVar10 >> 1;
      lVar12 = 0;
      bVar9 = false;
      do {
        ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((syntax->members).elements._M_ptr)->super_ConstTokenOrSyntax)
                                     .
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar12));
        pSVar2 = *ppSVar4;
        name = parsing::Token::valueText((Token *)(pSVar2 + 1));
        pSVar7 = Scope::find(local_b0,name);
        __addr_00 = pSVar2[2].parent;
        pTVar6 = DeclaredType::getType((DeclaredType *)(pSVar7 + 1));
        iVar3 = Pattern::bind((int)local_a8,(sockaddr *)__addr_00,(socklen_t)pTVar6);
        local_c0._M_extent._M_extent_value = CONCAT44(extraout_var_00,iVar3);
        iVar3 = *(int *)local_c0._M_extent._M_extent_value;
        local_c0._M_ptr = (pointer)pSVar7;
        SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::
        emplace_back<slang::ast::StructurePattern::FieldPattern>(local_98,(FieldPattern *)&local_c0)
        ;
        bVar9 = (bool)(bVar9 | iVar3 == 0);
        lVar12 = lVar12 + 0x30;
        uVar10 = uVar10 - 1;
        src.current = extraout_RDX_01;
      } while (uVar10 != 0);
      goto LAB_0033863d;
    }
  }
  bVar9 = false;
LAB_0033863d:
  pCVar1 = local_a0;
  iVar3 = SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::copy
                    (local_98,(EVP_PKEY_CTX *)local_a0,(EVP_PKEY_CTX *)src.current);
  local_c0._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar3);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pSVar8 = BumpAllocator::
           emplace<slang::ast::StructurePattern,std::span<slang::ast::StructurePattern::FieldPattern,18446744073709551615ul>,slang::SourceRange>
                     (&pCVar1->super_BumpAllocator,&local_c0,&local_40);
  if (bVar9) {
    local_c0._M_ptr = (pointer)pSVar8;
    pSVar8 = (StructurePattern *)
             BumpAllocator::emplace<slang::ast::InvalidPattern,slang::ast::Pattern_const*&>
                       (&pCVar1->super_BumpAllocator,(Pattern **)&local_c0);
  }
  if (local_98[0].data_ != (pointer)local_98[0].firstElement) {
    operator_delete(local_98[0].data_);
  }
  return &pSVar8->super_Pattern;
}

Assistant:

Pattern& StructurePattern::fromSyntax(const StructurePatternSyntax& syntax, const Type& targetType,
                                      const ASTContext& context) {
    auto& comp = context.getCompilation();
    SLANG_ASSERT(targetType.isStruct() && !syntax.members.empty());

    bool bad = false;
    auto& structScope = targetType.getCanonicalType().as<Scope>();

    SmallVector<FieldPattern, 4> patterns;
    if (syntax.members[0]->kind == SyntaxKind::OrderedStructurePatternMember) {
        auto fields = structScope.membersOfType<FieldSymbol>();
        auto it = fields.begin();
        for (auto memberSyntax : syntax.members) {
            SLANG_ASSERT(it != fields.end());

            auto& patternSyntax = *memberSyntax->as<OrderedStructurePatternMemberSyntax>().pattern;
            auto& pattern = bind(context, patternSyntax, it->getType());
            bad |= pattern.bad();

            patterns.push_back({&(*it), &pattern});
            it++;
        }

        SLANG_ASSERT(it == fields.end());
    }
    else {
        for (auto memberSyntax : syntax.members) {
            auto& nspms = memberSyntax->as<NamedStructurePatternMemberSyntax>();
            auto memberName = nspms.name.valueText();
            auto member = structScope.find(memberName);
            SLANG_ASSERT(member);

            auto& field = member->as<FieldSymbol>();
            auto& pattern = bind(context, *nspms.pattern, field.getType());
            bad |= pattern.bad();

            patterns.push_back({&field, &pattern});
        }
    }

    auto result = comp.emplace<StructurePattern>(patterns.copy(comp), syntax.sourceRange());
    if (bad)
        return badPattern(comp, result);

    return *result;
}